

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_36::NetworkHttpClient::connect
          (NetworkHttpClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PromiseArena **ppPVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>_2
  *params;
  Network *pNVar2;
  long lVar3;
  Exception *pEVar4;
  NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>> *this_00;
  SourceLocation location;
  SourceLocation location_00;
  TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_> TVar5;
  Disposer *pDVar6;
  void *pvVar7;
  PausableReadAsyncIoStream *pPVar8;
  Exception *pEVar9;
  undefined4 in_register_00000034;
  NetworkHttpClient *pNVar10;
  char *in_R9;
  Refcounted *refcounted;
  SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6329:47)>
  *location_01;
  undefined1 local_e8 [16];
  PausableReadAsyncIoStream *local_d8;
  Function<kj::Promise<void>_(kj::StringPtr)> cb;
  Own<kj::AsyncIoStream,_std::nullptr_t> connection;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  OwnPromiseNode intermediate;
  SplitTuplePromise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream>_>_>_>
  split;
  Maybe<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_> addr;
  Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> local_68;
  OwnPromiseNode local_58;
  anon_class_8_1_8991fb9c_for_func local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  pNVar10 = (NetworkHttpClient *)CONCAT44(in_register_00000034,__fd);
  addr.ptr.isSet = false;
  if (*in_R9 == '\x01') {
    pNVar2 = (pNVar10->tlsNetwork).ptr;
    if (pNVar2 == (Network *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
                ((Fault *)local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x18b3,FAILED,"tlsNetwork != nullptr","\"this HttpClient doesn\'t support TLS\"",
                 (char (*) [36])"this HttpClient doesn\'t support TLS");
      kj::_::Debug::Fault::fatal((Fault *)local_e8);
    }
    (**pNVar2->_vptr_Network)(local_e8);
    kj::_::NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>::
    emplace<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
              ((NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>> *)&addr,
               (Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)local_e8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_e8);
  }
  else {
    (**pNVar10->network->_vptr_Network)(local_e8);
    kj::_::NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>::
    emplace<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>>
              ((NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,decltype(nullptr)>>> *)&addr,
               (Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)local_e8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_e8);
  }
  if (addr.ptr.isSet != false) {
    params = &addr.ptr.field_1;
    connection.disposer =
         (Disposer *)
         (anonymous_namespace)::NetworkHttpClient::
         connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(auto:1)#1}::
         operator();
    lVar3 = *(long *)((long)addr.ptr.field_1 + 8);
    local_50.this = pNVar10;
    if (lVar3 == 0 || (ulong)((long)addr.ptr.field_1 - lVar3) < 0x28) {
      pvVar7 = operator_new(0x400);
      location_01 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6329:47)>
                     *)((long)pvVar7 + 0x3d8);
      ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(auto:1)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(auto:1)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&params->value,
                 &local_50,&connection.disposer);
      *(void **)((long)pvVar7 + 0x3e0) = pvVar7;
    }
    else {
      *(undefined8 *)((long)addr.ptr.field_1 + 8) = 0;
      location_01 = (SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,_std::nullptr_t>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:6329:47)>
                     *)((long)addr.ptr.field_1 + -0x28);
      ctor<kj::_::SimpleTransformPromiseNode<kj::Own<kj::NetworkAddress,decltype(nullptr)>,kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(auto:1)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(auto:1)_1_,void*&>
                (location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&params->value,
                 &local_50,&connection.disposer);
      *(long *)((long)addr.ptr.field_1 + -0x20) = lVar3;
    }
    local_e8._0_8_ = &DAT_003d3151;
    local_e8._8_8_ = &DAT_003d31b0;
    local_d8 = (PausableReadAsyncIoStream *)0x4c0000058b;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_01;
    kj::_::
    maybeChain<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>>>
              ((OwnPromiseNode *)&local_68,
               (Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
                *)&intermediate,location);
    pDVar6 = local_68.disposer;
    local_68.disposer = (Disposer *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_68);
    local_a8.ptr = (PromiseNode *)pDVar6;
    cb.impl.disposer = (Disposer *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&cb);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_40 = "connect";
    local_38 = 0x28000018b9;
    location_00.function = "connect";
    location_00.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    location_00.lineNumber = 0x18b9;
    location_00.columnNumber = 0x28;
    Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
    ::split((Promise<kj::_::Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>_>
             *)&split,location_00);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
    local_58.ptr = (PromiseNode *)
                   split.impl.
                   super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
                   .value.super_PromiseBase.node.ptr;
    split.impl.super_TupleElement<1U,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>.
    value.super_PromiseBase.node.ptr =
         (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>)(PromiseBase)0x0;
    newPromisedStream((kj *)&connection,
                      (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_58);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
    if (((*in_R9 == '\0') &&
        (pEVar4 = (Exception *)(pNVar10->settings).tlsContext.ptr, pEVar4 != (Exception *)0x0)) &&
       (this_00 = *(NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>> **)(in_R9 + 8),
       this_00 != (NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>> *)0x0)) {
      pPVar8 = (PausableReadAsyncIoStream *)operator_new(0x20);
      local_e8._8_8_ = connection.ptr;
      connection.ptr = (AsyncIoStream *)0x0;
      local_e8._0_8_ = connection.disposer;
      (pPVar8->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
           (_func_int **)&PTR_read_00592e80;
      (pPVar8->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
           (_func_int **)&PTR_write_00592f20;
      heap<kj::PausableReadAsyncIoStream,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                ((kj *)&pPVar8->inner,(Own<kj::AsyncIoStream,_std::nullptr_t> *)local_e8);
      cb.impl.disposer =
           (Disposer *)
           &kj::_::HeapDisposer<kj::(anonymous_namespace)::TransitionaryAsyncIoStream>::instance;
      cb.impl.ptr = (Iface *)pPVar8;
      Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_e8);
      pEVar9 = (Exception *)operator_new(0x20);
      cb.impl.ptr = (Iface *)0x0;
      local_e8._0_8_ =
           &kj::_::HeapDisposer<kj::(anonymous_namespace)::TransitionaryAsyncIoStream>::instance;
      (pEVar9->ownFile).content.ptr = (char *)&PTR_disposeImpl_00592e40;
      (pEVar9->ownFile).content.disposer =
           (ArrayDisposer *)
           &kj::_::HeapDisposer<kj::(anonymous_namespace)::TransitionaryAsyncIoStream>::instance;
      local_e8._8_8_ = (TransitionaryAsyncIoStream *)0x0;
      pEVar9->file = (char *)pPVar8;
      *(undefined4 *)&(pEVar9->ownFile).content.size_ = 1;
      intermediate.ptr = (PromiseNode *)pEVar9;
      Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> *)
                 local_e8);
      Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> *)&cb);
      ppPVar1 = (PromiseArena **)&(pEVar9->ownFile).content.size_;
      *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
      pPVar8 = (PausableReadAsyncIoStream *)pEVar9->file;
      local_e8._0_8_ = pEVar4;
      local_e8._8_8_ = pEVar9;
      local_d8 = pPVar8;
      cb.impl.ptr = (Iface *)operator_new(0x20);
      (cb.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00592fa0;
      cb.impl.ptr[1]._vptr_Iface = (_func_int **)pEVar4;
      cb.impl.ptr[2]._vptr_Iface = (_func_int **)pEVar9;
      local_d8 = (PausableReadAsyncIoStream *)0x0;
      cb.impl.ptr[3]._vptr_Iface = (_func_int **)pPVar8;
      cb.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<kj::Promise<void>(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::NetworkHttpClient::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(kj::StringPtr)#1}>>
            ::instance;
      Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t> *)
                 (local_e8 + 8));
      ppPVar1 = (PromiseArena **)&(pEVar9->ownFile).content.size_;
      *(int *)ppPVar1 = *(int *)ppPVar1 + 1;
      local_e8._8_8_ = pEVar9->file;
      local_68.ptr = (TransitionaryAsyncIoStream *)0x0;
      local_e8._0_8_ = pEVar9;
      local_68.disposer = (Disposer *)pEVar9;
      Own<kj::AsyncIoStream,_std::nullptr_t>::operator=
                (&connection,(Own<kj::AsyncIoStream,_std::nullptr_t> *)local_e8);
      Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_e8);
      Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>::~Own(&local_68);
      kj::_::NullableValue<kj::Function<kj::Promise<void>(kj::StringPtr)>>::
      emplace<kj::Function<kj::Promise<void>(kj::StringPtr)>>(this_00,&cb);
      Own<kj::Function<kj::Promise<void>_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&cb.impl)
      ;
      Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
      ::~Own((Own<kj::RefcountedWrapper<kj::Own<kj::(anonymous_namespace)::TransitionaryAsyncIoStream,_std::nullptr_t>_>,_std::nullptr_t>
              *)&intermediate);
    }
    TVar5.value.super_PromiseBase.node.ptr =
         split.impl.super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.
         value.super_PromiseBase.node.ptr;
    split.impl.super_TupleElement<0U,_kj::Promise<kj::HttpClient::ConnectRequest::Status>_>.value.
    super_PromiseBase.node.ptr = (Promise<kj::HttpClient::ConnectRequest::Status>)(PromiseBase)0x0;
    (this->super_HttpClient)._vptr_HttpClient = (_func_int **)TVar5.value.super_PromiseBase.node.ptr
    ;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)connection.disposer;
    this->timer = (Timer *)connection.ptr;
    connection.ptr = (AsyncIoStream *)0x0;
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&connection);
    kj::_::
    TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Promise<kj::HttpClient::ConnectRequest::Status>,_kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>_>
    ::~TupleImpl(&split.impl);
    kj::_::NullableValue<kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>_>::~NullableValue
              (&addr.ptr);
    return (int)this;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x18b9,FAILED,"addr != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)local_e8);
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers,
      HttpConnectSettings connectSettings) override {
    // We want to connect directly instead of going through a proxy here.
    // https://github.com/capnproto/capnproto/pull/1454#discussion_r900414879
    kj::Maybe<kj::Promise<kj::Own<kj::NetworkAddress>>> addr;
    if (connectSettings.useTls) {
      kj::Network& tlsNet = KJ_REQUIRE_NONNULL(tlsNetwork, "this HttpClient doesn't support TLS");
      addr = tlsNet.parseAddress(host);
    } else {
      addr = network.parseAddress(host);
    }

    auto split = KJ_ASSERT_NONNULL(addr).then([this](auto address) {
      return address->connect().then([this](auto connection)
          -> kj::Tuple<kj::Promise<ConnectRequest::Status>,
                       kj::Promise<kj::Own<kj::AsyncIoStream>>> {
        return kj::tuple(
            ConnectRequest::Status(
              200,
              kj::str("OK"),
              kj::heap<kj::HttpHeaders>(responseHeaderTable) // Empty headers
            ),
            kj::mv(connection));
      }).attach(kj::mv(address));
    }).split();

    auto connection = kj::newPromisedStream(kj::mv(kj::get<1>(split)));

    if (!connectSettings.useTls) {
      KJ_IF_SOME(wrapper, settings.tlsContext) {
        KJ_IF_SOME(tlsStarter, connectSettings.tlsStarter) {
          auto transitConnectionRef = kj::refcountedWrapper(
              kj::heap<TransitionaryAsyncIoStream>(kj::mv(connection)));
          Function<kj::Promise<void>(kj::StringPtr)> cb =
              [&wrapper, ref1 = transitConnectionRef->addWrappedRef()](
              kj::StringPtr expectedServerHostname) mutable {
            ref1->startTls(&wrapper, expectedServerHostname);
            return kj::READY_NOW;
          };
          connection = transitConnectionRef->addWrappedRef();
          tlsStarter = kj::mv(cb);
        }
      }
    }

    return ConnectRequest {
      kj::mv(kj::get<0>(split)),
      kj::mv(connection)
    };
  }